

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setDrawPlane(SlicePlane *this,bool newVal)

{
  undefined1 in_SIL;
  bool *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  PersistentValue<bool>::operator=
            ((PersistentValue<bool> *)
             (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffe8);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setDrawPlane(bool newVal) {
  drawPlane = newVal;
  polyscope::requestRedraw();
}